

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

bool wasm::hasActiveSegments(Module *wasm)

{
  byte bVar1;
  pointer puVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  puVar2 = (wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(wasm->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar3 == 0) {
    return false;
  }
  uVar4 = 1;
  uVar5 = 0;
  do {
    bVar1 = *(byte *)((long)puVar2[uVar5]._M_t.
                            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                            ._M_t + 0x28);
    if (bVar1 != 1) break;
    uVar5 = (ulong)uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar5 < (ulong)(lVar3 >> 3));
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool hasActiveSegments(Module& wasm) {
  for (Index i = 0; i < wasm.dataSegments.size(); i++) {
    if (!wasm.dataSegments[i]->isPassive) {
      return true;
    }
  }
  return false;
}